

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceGroupCommand.cxx
# Opt level: O0

string * anon_unknown.dwarf_3908c8::getFullFilePath
                   (string *__return_storage_ptr__,string *currentPath,string *path)

{
  bool bVar1;
  undefined1 local_40 [8];
  string fullPath;
  string *path_local;
  string *currentPath_local;
  
  fullPath.field_2._8_8_ = path;
  std::__cxx11::string::string((string *)local_40,(string *)path);
  bVar1 = cmsys::SystemTools::FileIsFullPath((string *)fullPath.field_2._8_8_);
  if (!bVar1) {
    std::__cxx11::string::operator=((string *)local_40,(string *)currentPath);
    std::__cxx11::string::operator+=((string *)local_40,"/");
    std::__cxx11::string::operator+=((string *)local_40,(string *)fullPath.field_2._8_8_);
  }
  cmsys::SystemTools::CollapseFullPath(__return_storage_ptr__,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string getFullFilePath(const std::string& currentPath,
                            const std::string& path)
{
  std::string fullPath = path;

  if (!cmSystemTools::FileIsFullPath(path)) {
    fullPath = currentPath;
    fullPath += "/";
    fullPath += path;
  }

  return cmSystemTools::CollapseFullPath(fullPath);
}